

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O3

int ndn_signed_interest_hmac_sign
              (ndn_interest_t *interest,ndn_name_t *identity,ndn_hmac_key_t *hmac_key)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint8_t uVar8;
  uint uVar9;
  ndn_interest_t *component;
  ulong uVar10;
  uint8_t local_2f8 [692];
  uint32_t local_44;
  undefined1 auStack_40 [4];
  uint32_t used_bytes;
  ndn_encoder_t temp_encoder;
  
  if (9 < (interest->name).components_size) {
    return -10;
  }
  _prepare_signature_info(interest,'\x04',identity,hmac_key->key_id);
  memset(local_2f8,0,0x2a8);
  temp_encoder.output_value = (uint8_t *)0x2a8;
  uVar9 = 0;
  _auStack_40 = local_2f8;
  if ((interest->name).components_size != '\0') {
    uVar10 = 0;
    component = interest;
    do {
      iVar3 = name_component_tlv_encode((ndn_encoder_t *)auStack_40,(name_component_t *)component);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar10 = uVar10 + 1;
      component = (ndn_interest_t *)((component->name).components + 1);
    } while (uVar10 < (interest->name).components_size);
    uVar9 = temp_encoder.output_value._4_4_;
  }
  if ((interest->flags & 0x40) != 0) {
    if ((uint)temp_encoder.output_value == uVar9) {
      return -0xe;
    }
    _auStack_40[uVar9] = '$';
    uVar6 = temp_encoder.output_value._4_4_ + 1;
    uVar2 = (interest->parameters).size;
    iVar3 = 1;
    uVar5 = uVar6;
    if (0xfc < uVar2 || (uint)temp_encoder.output_value == uVar6) {
      if (uVar2 < 0x10000 && 2 < (uint)temp_encoder.output_value - uVar6) {
        iVar3 = 3;
        iVar4 = 2;
        iVar7 = 1;
        uVar8 = 0xfd;
      }
      else {
        if ((uint)temp_encoder.output_value - uVar6 < 5) {
          return -0xe;
        }
        _auStack_40[uVar6] = 0xfe;
        _auStack_40[temp_encoder.output_value._4_4_ + 2] = (uint8_t)(uVar2 >> 0x18);
        uVar8 = (uint8_t)(uVar2 >> 0x10);
        uVar5 = temp_encoder.output_value._4_4_ + 3;
        iVar3 = 5;
        iVar4 = 4;
        iVar7 = 3;
      }
      _auStack_40[uVar5] = uVar8;
      _auStack_40[iVar7 + uVar6] = (uint8_t)(uVar2 >> 8);
      uVar5 = iVar4 + uVar6;
    }
    _auStack_40[uVar5] = (uint8_t)uVar2;
    uVar6 = iVar3 + uVar6;
    temp_encoder.output_value = (uint8_t *)CONCAT44(uVar6,(uint)temp_encoder.output_value);
    uVar2 = (interest->parameters).size;
    if ((int)((uint)temp_encoder.output_value - uVar6) < (int)uVar2) {
      return -10;
    }
    memcpy(_auStack_40 + uVar6,&interest->parameters,(ulong)uVar2);
    temp_encoder.output_value =
         (uint8_t *)
         CONCAT44(temp_encoder.output_value._4_4_ + uVar2,(uint)temp_encoder.output_value);
  }
  iVar3 = ndn_signature_info_tlv_encode((ndn_encoder_t *)auStack_40,&interest->signature);
  if (iVar3 == 0) {
    local_44 = 0;
    iVar3 = ndn_hmac_sign(_auStack_40,temp_encoder.output_value._4_4_,
                          (interest->signature).sig_value,0x80,hmac_key,&local_44);
    if (-1 < iVar3) {
      (interest->signature).sig_size = local_44;
      iVar3 = ndn_signature_value_tlv_encode((ndn_encoder_t *)auStack_40,&interest->signature);
      if (iVar3 == 0) {
        iVar3 = ndn_sha256(_auStack_40 + uVar9,temp_encoder.output_value._4_4_ - uVar9,
                           (interest->name).components[(interest->name).components_size].value);
        if (-1 < iVar3) {
          bVar1 = (interest->name).components_size;
          (interest->name).components[bVar1].type = 2;
          (interest->name).components[bVar1].size = ' ';
          (interest->name).components_size = bVar1 + 1;
          interest->flags = interest->flags | 0x80;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
ndn_signed_interest_hmac_sign(ndn_interest_t* interest,
                              const ndn_name_t* identity, const ndn_hmac_key_t* hmac_key)
{
  int ret_val = -1;
  if (interest->name.components_size + 1 > NDN_NAME_COMPONENTS_SIZE)
    return NDN_OVERSIZE;

  // set signature info
  _prepare_signature_info(interest, NDN_SIG_TYPE_HMAC_SHA256, identity, hmac_key->key_id);

  // update signature value and append the ending name component
  // prepare temp buffer to calculate signature value and the ending name component
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);
  // the signing input starts at Name's Value (V)
  for (size_t i = 0; i < interest->name.components_size; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;

  // calculate signature
  // signature is calculated over Name + Parameters + SignatureInfo
  uint32_t used_bytes = 0;
  int result = NDN_SUCCESS;
  result = ndn_hmac_sign(temp_encoder.output_value, siginfo_block_ending,
                         interest->signature.sig_value, NDN_SIGNATURE_BUFFER_SIZE,
                         hmac_key, &used_bytes);
  if (result < 0) return result;
  interest->signature.sig_size = used_bytes;

  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // calculate the SignedInterestSha256DigestComponent
  // component is calculated over Name + Parameters + SignatureInfo + SignatureValue
  result = ndn_sha256(&temp_encoder.output_value[param_block_starting],
                      temp_encoder.offset - param_block_starting,
                      interest->name.components[interest->name.components_size].value);
  if (result < 0) return result;
  interest->name.components[interest->name.components_size].type = TLV_ParametersSha256DigestComponent;
  interest->name.components[interest->name.components_size].size = NDN_SEC_SHA256_HASH_SIZE;
  interest->name.components_size++;
  BIT_SET(interest->flags, 7);
  return NDN_SUCCESS;
}